

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O2

Debug * __thiscall Corrade::Utility::Debug::print<unsigned_long>(Debug *this,unsigned_long *value)

{
  byte bVar1;
  ostream *poVar2;
  Error EStack_38;
  
  poVar2 = this->_output;
  if (poVar2 != (ostream *)0x0) {
    if (this->_sourceLocationFile != (char *)0x0) {
      if (((this->_immediateFlags)._value & 4) == 0) {
        Error::Error(&EStack_38,(ostream *)&std::cerr,(Flags)0x0);
        operator<<(&EStack_38.super_Debug,
                   "Assertion _immediateFlags & Flag::NoSpace failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Debug.cpp:700"
                  );
        Error::~Error(&EStack_38);
        abort();
      }
      poVar2 = std::operator<<(poVar2,this->_sourceLocationFile);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_sourceLocationLine);
      std::operator<<(poVar2,": ");
      this->_sourceLocationFile = (char *)0x0;
      poVar2 = this->_output;
    }
    bVar1 = (this->_immediateFlags)._value | (this->_flags)._value;
    if ((bVar1 & 4) == 0) {
      std::operator<<(poVar2,' ');
      poVar2 = this->_output;
      bVar1 = (this->_immediateFlags)._value | (this->_flags)._value;
    }
    if ((char)bVar1 < '\0') {
      poVar2 = std::operator<<(poVar2,"0x");
      *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
      poVar2 = this->_output;
    }
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    if ((char)((this->_immediateFlags)._value | (this->_flags)._value) < '\0') {
      poVar2 = this->_output;
      *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    }
    (this->_immediateFlags)._value = '\0';
    (this->_internalFlags)._value = (this->_internalFlags)._value | 2;
  }
  return this;
}

Assistant:

Debug& Debug::print(const T& value) {
    if(!_output) return *this;

    #ifdef CORRADE_SOURCE_LOCATION_BUILTINS_SUPPORTED
    /* Print source location, if not printed yet */
    if(_sourceLocationFile) {
        CORRADE_INTERNAL_ASSERT(_immediateFlags & Flag::NoSpace);
        *_output << _sourceLocationFile << ":" << _sourceLocationLine << ": ";
        _sourceLocationFile = nullptr;
    }
    #endif

    /* Separate values with spaces if enabled */
    if(!((_immediateFlags|_flags) & Flag::NoSpace))
        *_output << ' ';
    /* Print the next value as hexadecimal if enabled */
    /** @todo this does strange crap for negative values (printing them as
        unsigned), revisit once iostreams are not used anymore */
    if(((_immediateFlags|_flags) & Flag::Hex) && std::is_integral<T>::value)
        *_output << "0x" << std::hex;

    toStream(*_output, value);

    /* Reset the hexadecimal printing back if it was enabled */
    if(((_immediateFlags|_flags) & Flag::Hex) && std::is_integral<T>::value)
        *_output << std::dec;

    /* Reset all immediate flags after */
    _immediateFlags = {};

    _internalFlags |= InternalFlag::ValueWritten;
    return *this;
}